

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O1

AdbcStatusCode AdbcConnectionNew(AdbcConnection *connection,AdbcError *error)

{
  long *plVar1;
  
  plVar1 = (long *)operator_new(0xe0);
  *plVar1 = (long)(plVar1 + 6);
  plVar1[1] = 1;
  plVar1[2] = 0;
  plVar1[3] = 0;
  *(undefined4 *)(plVar1 + 4) = 0x3f800000;
  plVar1[5] = 0;
  plVar1[6] = 0;
  plVar1[7] = (long)(plVar1 + 0xd);
  plVar1[8] = 1;
  plVar1[9] = 0;
  plVar1[10] = 0;
  *(undefined4 *)(plVar1 + 0xb) = 0x3f800000;
  plVar1[0xc] = 0;
  plVar1[0xd] = 0;
  plVar1[0xe] = (long)(plVar1 + 0x14);
  plVar1[0xf] = 1;
  plVar1[0x10] = 0;
  plVar1[0x11] = 0;
  *(undefined4 *)(plVar1 + 0x12) = 0x3f800000;
  plVar1[0x13] = 0;
  plVar1[0x14] = 0;
  plVar1[0x15] = (long)(plVar1 + 0x1b);
  plVar1[0x16] = 1;
  plVar1[0x17] = 0;
  plVar1[0x18] = 0;
  *(undefined4 *)(plVar1 + 0x19) = 0x3f800000;
  plVar1[0x1a] = 0;
  plVar1[0x1b] = 0;
  connection->private_data = plVar1;
  connection->private_driver = (AdbcDriver *)0x0;
  return '\0';
}

Assistant:

AdbcStatusCode AdbcConnectionNew(struct AdbcConnection *connection, struct AdbcError *error) {
	// Allocate a temporary structure to store options pre-Init, because
	// we don't get access to the database (and hence the driver
	// function table) until then
	connection->private_data = new TempConnection;
	connection->private_driver = nullptr;
	return ADBC_STATUS_OK;
}